

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O1

void __thiscall
Js::JavascriptStackWalker::SetCachedInternalFrameInfo
          (JavascriptStackWalker *this,InternalFrameType frameType,JavascriptFunction *function,
          bool hasInlinedFramesOnStack,bool previousInterpreterFrameIsFromBailout)

{
  size_t sVar1;
  
  if ((this->lastInternalFrameInfo).codeAddress == (void *)0x0) {
    sVar1 = (this->currentFrame).stackCheckCodeHeight;
    (this->lastInternalFrameInfo).codeAddress = (this->currentFrame).codeAddr;
    (this->lastInternalFrameInfo).framePointer = (this->currentFrame).frame;
    (this->lastInternalFrameInfo).stackCheckCodeHeight = sVar1;
    (this->lastInternalFrameInfo).frameType = frameType;
    (this->lastInternalFrameInfo).function = function;
    (this->lastInternalFrameInfo).hasInlinedFramesOnStack = hasInlinedFramesOnStack;
    (this->lastInternalFrameInfo).previousInterpreterFrameIsFromBailout =
         previousInterpreterFrameIsFromBailout;
  }
  return;
}

Assistant:

void JavascriptStackWalker::SetCachedInternalFrameInfo(InternalFrameType frameType, JavascriptFunction* function, bool hasInlinedFramesOnStack, bool previousInterpreterFrameIsFromBailout)
    {
        if (!this->lastInternalFrameInfo.codeAddress)
        {
            this->lastInternalFrameInfo.Set(
                this->GetCurrentCodeAddr(),
                this->currentFrame.GetFrame(),
                this->currentFrame.GetStackCheckCodeHeight(),
                frameType,
                function,
                hasInlinedFramesOnStack,
                previousInterpreterFrameIsFromBailout);
        }
    }